

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall MobileElementManager::UpdatePropensity(MobileElementManager *this,int index)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  SpeciesTracker *this_00;
  string *psVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *pmVar5;
  ulong uVar6;
  runtime_error *this_01;
  pointer ppVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_02;
  pointer ppVar8;
  reference pvVar9;
  double dVar10;
  double diff;
  double new_speed;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *anticodon;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  const_iterator anticodons;
  string codon;
  double weight;
  SpeciesTracker *tracker;
  undefined1 local_28 [4];
  int position_index;
  shared_ptr<MobileElement> pol;
  int index_local;
  MobileElementManager *this_local;
  
  pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = index;
  GetPol((MobileElementManager *)local_28,(int)this);
  peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  iVar2 = MobileElement::stop(peVar3);
  this_00 = SpeciesTracker::Instance();
  codon.field_2._8_8_ = 0x3ff0000000000000;
  peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  psVar4 = MobileElement::name_abi_cxx11_(peVar3);
  bVar1 = std::operator==(psVar4,"__ribosome");
  if (bVar1) {
    pmVar5 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(pmVar5);
    if (!bVar1) {
      uVar6 = std::__cxx11::string::size();
      if ((uVar6 <= (ulong)(long)iVar2) || (iVar2 < 0)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Genome sequence not correct size.");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      codon.field_2._8_8_ = 0;
      peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      MobileElement::stop(peVar3);
      std::__cxx11::string::substr((ulong)&anticodons,(ulong)&this->seq_);
      pmVar5 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::find(pmVar5,(key_type *)&anticodons);
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&__range2);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&ppVar7->second);
      anticodon = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&ppVar7->second);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&anticodon), bVar1) {
        local_98 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
        this_02 = SpeciesTracker::species_abi_cxx11_(this_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &new_speed,local_98,"_charged");
        local_a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(this_02,(key_type *)&new_speed);
        ppVar8 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&local_a0);
        codon.field_2._8_8_ = (size_type)((double)ppVar8->second + codon.field_2._8_8_);
        std::__cxx11::string::~string((string *)&new_speed);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::string::~string((string *)&anticodons);
      goto LAB_0011bce5;
    }
  }
  peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  psVar4 = MobileElement::name_abi_cxx11_(peVar3);
  bVar1 = std::operator==(psVar4,"__ribosome");
  if ((bVar1) &&
     (bVar1 = std::vector<double,_std::allocator<double>_>::empty(&this->weights_), !bVar1)) {
    peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    iVar2 = MobileElement::stop(peVar3);
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->weights_,(long)(iVar2 + -1));
    codon.field_2._8_8_ = *pvVar9 + 0.0;
  }
LAB_0011bce5:
  peVar3 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  dVar10 = MobileElement::speed(peVar3);
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->prop_list_,
                      (long)pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_);
  this->prop_sum_ = ((double)codon.field_2._8_8_ * dVar10 - *pvVar9) + this->prop_sum_;
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->prop_list_,
                      (long)pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_);
  *pvVar9 = (double)codon.field_2._8_8_ * dVar10;
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_28);
  return;
}

Assistant:

void MobileElementManager::UpdatePropensity(int index) {
  auto pol = GetPol(index);
  int position_index = pol->stop();
  auto &tracker = SpeciesTracker::Instance();
  double weight = 1; 
  if (pol->name() == "__ribosome" && !tracker.codon_map().empty()) {
    if (position_index >= seq_.size() || position_index < 0) {
      throw std::runtime_error("Genome sequence not correct size.");
    }
    weight--;
    std::string codon = seq_.substr(pol->stop(), 3);
    //std::cout << codon << std::endl;
    // std::vector<std::string> stop_codons = {"TAG", "TAA", "TGA"};
    // check if occupied codon is a stop codon
    // if (std::find(stop_codons.begin(), stop_codons.end(), codon) == stop_codons.end()) {
    auto anticodons = tracker.codon_map().find(codon);
    for (auto const& anticodon : anticodons->second) {
      // std::cout << anticodon << std::endl;
      weight += tracker.species().find(anticodon + "_charged")->second;
    }
  } else if (pol->name() == "__ribosome" && !weights_.empty()) {
      weight--;
      weight += weights_[pol->stop() - 1];
  }
  double new_speed = weight * pol->speed();
  double diff = new_speed - prop_list_[index];
  prop_sum_ += diff;
  prop_list_[index] = new_speed;
}